

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void memcpy_endian(void *dst,void *src,size_t n)

{
  size_t i;
  anon_union_4_2_94730034 host_endian;
  size_t n_local;
  void *src_local;
  void *dst_local;
  
  memcpy(dst,src,n);
  return;
}

Assistant:

static void memcpy_endian(void *dst, void *src, size_t n)
{
  union { uint8_t b; uint32_t u; } host_endian;
  host_endian.u = 1;
  if (host_endian.b == LJ_ENDIAN_SELECT(1, 0)) {
    memcpy(dst, src, n);
  } else {
    size_t i;
    for (i = 0; i < n; i++)
      ((uint8_t *)dst)[i] = ((uint8_t *)src)[n-i-1];
  }
}